

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O3

void duckdb::HTTPLoggingOutputSetting::SetLocal(ClientContext *context,Value *input)

{
  ClientConfig *pCVar1;
  string local_38;
  
  pCVar1 = ClientConfig::GetConfig(context);
  Value::GetValue<std::__cxx11::string>(&local_38,input);
  ::std::__cxx11::string::operator=((string *)&pCVar1->http_logging_output,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HTTPLoggingOutputSetting::SetLocal(ClientContext &context, const Value &input) {
	auto &config = ClientConfig::GetConfig(context);
	config.http_logging_output = input.GetValue<string>();
}